

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_constdump(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int i;
  int sn;
  FILE *fp2;
  FILE *fp;
  CHAR_DATA *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  int local_28;
  int local_24;
  
  __stream = fopen("../logs/constdump.txt","w");
  if (__stream != (FILE *)0x0) {
    local_24 = 0;
    while( true ) {
      fprintf(__stream,"\t{\n");
      fprintf(__stream,"\t\t\"%s\"\t\t{ ",skill_table[local_24].name);
      for (local_28 = 0; local_28 < 0xc; local_28 = local_28 + 1) {
        fprintf(__stream,"%i, ",
                (ulong)(uint)(int)*(short *)((long)local_24 * 0x60 + 0x8daef8 + (long)local_28 * 2))
        ;
      }
      fprintf(__stream,"},\n");
      fprintf(__stream,"\t\t{ ");
      fprintf(__stream,"},\n");
      if (skill_table[local_24].target == 1) {
        local_38 = "TAR_CHAR_OFFENSIVE";
      }
      else {
        if (skill_table[local_24].target == 2) {
          local_40 = "TAR_CHAR_DEFENSIVE";
        }
        else {
          if (skill_table[local_24].target == 8) {
            local_48 = "TAR_CHAR_AMBIGUOUS";
          }
          else {
            if (skill_table[local_24].target == 0) {
              local_50 = "TAR_IGNORE";
            }
            else {
              if (skill_table[local_24].target == 3) {
                local_58 = "TAR_CHAR_SELF";
              }
              else {
                if (skill_table[local_24].target == 9) {
                  local_60 = "TAR_CHAR_GENERAL";
                }
                else {
                  if (skill_table[local_24].target == 4) {
                    local_68 = "TAR_OBJ_INV";
                  }
                  else {
                    if (skill_table[local_24].target == 5) {
                      local_70 = "TAR_OBJ_CHAR_DEF";
                    }
                    else {
                      if (skill_table[local_24].target == 6) {
                        local_78 = "TAR_OBJ_CHAR_OFF";
                      }
                      else {
                        if (skill_table[local_24].target == 7) {
                          local_80 = "TAR_DIR";
                        }
                        else {
                          local_80 = "ERROR";
                          if (skill_table[local_24].target == 0x29a) {
                            local_80 = "TAR_END";
                          }
                        }
                        local_78 = local_80;
                      }
                      local_70 = local_78;
                    }
                    local_68 = local_70;
                  }
                  local_60 = local_68;
                }
                local_58 = local_60;
              }
              local_50 = local_58;
            }
            local_48 = local_50;
          }
          local_40 = local_48;
        }
        local_38 = local_40;
      }
      fprintf(__stream,"\t\tspell_null,\t\t%s,",local_38);
      if (skill_table[local_24].minimum_position == 0) {
        local_90 = "POS_DEAD";
      }
      else {
        if (skill_table[local_24].minimum_position == 1) {
          local_98 = "POS_MORTAL";
        }
        else {
          if (skill_table[local_24].minimum_position == 2) {
            local_a0 = "POS_INCAP";
          }
          else {
            if (skill_table[local_24].minimum_position == 3) {
              local_a8 = "POS_STUNNED";
            }
            else {
              if (skill_table[local_24].minimum_position == 4) {
                local_b0 = "POS_SLEEPING";
              }
              else {
                if (skill_table[local_24].minimum_position == 5) {
                  local_b8 = "POS_RESTING";
                }
                else {
                  if (skill_table[local_24].minimum_position == 6) {
                    local_c0 = "POS_SITTING";
                  }
                  else {
                    if (skill_table[local_24].minimum_position == 7) {
                      local_c8 = "POS_FIGHTING";
                    }
                    else {
                      local_c8 = "ERROR";
                      if (skill_table[local_24].minimum_position == 8) {
                        local_c8 = "POS_STANDING";
                      }
                    }
                    local_c0 = local_c8;
                  }
                  local_b8 = local_c0;
                }
                local_b0 = local_b8;
              }
              local_a8 = local_b0;
            }
            local_a0 = local_a8;
          }
          local_98 = local_a0;
        }
        local_90 = local_98;
      }
      fprintf(__stream,"\t\t%s,\n",local_90);
      pcVar3 = "";
      if ((skill_table[local_24].dispel & 1U) != 0) {
        pcVar3 = "CAN_DISPEL";
      }
      pcVar2 = "";
      if ((skill_table[local_24].dispel & 2U) != 0) {
        pcVar2 = "CAN_CANCEL";
      }
      pcVar4 = "";
      if ((skill_table[local_24].dispel & 4U) != 0) {
        pcVar4 = "CAN_CLEANSE";
      }
      pcVar5 = "";
      if ((skill_table[local_24].dispel & 8U) != 0) {
        pcVar5 = "CAN_PURIFY";
      }
      iVar6 = (int)skill_table[local_24].min_mana;
      iVar1 = (int)skill_table[local_24].beats;
      fprintf(__stream,"\t\t&gsn_none,\t%s%s%s%s,\t%d,\t%d,\n",pcVar3,pcVar2,pcVar4,pcVar5,iVar6,
              iVar1);
      if (skill_table[local_24].ctype == 1) {
        local_f0 = "CMD_SPELL";
      }
      else {
        if (skill_table[local_24].ctype == 2) {
          local_f8 = "CMD_COMMUNE";
        }
        else {
          if (skill_table[local_24].ctype == 3) {
            local_100 = "CMD_POWER";
          }
          else {
            if (skill_table[local_24].ctype == 4) {
              local_108 = "CMD_BOTH";
            }
            else if (skill_table[local_24].ctype == 5) {
              in_stack_fffffffffffffef0 = "CMD_RUNE";
              local_108 = in_stack_fffffffffffffef0;
            }
            else {
              in_stack_fffffffffffffef0 = "ERROR";
              local_108 = in_stack_fffffffffffffef0;
              if (skill_table[local_24].ctype == 0) {
                in_stack_fffffffffffffef0 = "CMD_NONE";
                local_108 = in_stack_fffffffffffffef0;
              }
            }
            local_100 = local_108;
          }
          local_f8 = local_100;
        }
        local_f0 = local_f8;
      }
      fprintf(__stream,"\t\t\"%s\",\t\"%s\",\t\"%s\",\t%s\n",skill_table[local_24].noun_damage,
              skill_table[local_24].msg_off,skill_table[local_24].room_msg_off,local_f0,iVar6,iVar1)
      ;
      fprintf(__stream,"\t},\n\n");
      if (skill_table[local_24].target == 0x29a) break;
      local_24 = local_24 + 1;
    }
    fclose(__stream);
    send_to_char(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

void do_constdump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(CONST_DUMP_FILE, "w"), *fp2;
	int sn, i;

	if (!fp)
		return;

	for (sn = 0;; sn++)
	{
		fprintf(fp, "\t{\n");
		fprintf(fp, "\t\t\"%s\"\t\t{ ", skill_table[sn].name);

		for (i = 0; i < MAX_CLASS; i++)
		{
			fprintf(fp, "%i, ", skill_table[sn].skill_level[i]);
		}

		fprintf(fp, "},\n");
		fprintf(fp, "\t\t{ ");
		fprintf(fp, "},\n");
		fprintf(fp, "\t\tspell_null,\t\t%s,",
			skill_table[sn].target == TAR_CHAR_OFFENSIVE ? "TAR_CHAR_OFFENSIVE" :
			skill_table[sn].target == TAR_CHAR_DEFENSIVE ? "TAR_CHAR_DEFENSIVE" :
			skill_table[sn].target == TAR_CHAR_AMBIGUOUS ? "TAR_CHAR_AMBIGUOUS" :
			skill_table[sn].target == TAR_IGNORE ? "TAR_IGNORE" :
			skill_table[sn].target == TAR_CHAR_SELF ? "TAR_CHAR_SELF" :
			skill_table[sn].target == TAR_CHAR_GENERAL ? "TAR_CHAR_GENERAL" :
			skill_table[sn].target == TAR_OBJ_INV ? "TAR_OBJ_INV" :
			skill_table[sn].target == TAR_OBJ_CHAR_DEF ? "TAR_OBJ_CHAR_DEF" :
			skill_table[sn].target == TAR_OBJ_CHAR_OFF ? "TAR_OBJ_CHAR_OFF" :
			skill_table[sn].target == TAR_DIR ? "TAR_DIR" :
			skill_table[sn].target == TAR_END ? "TAR_END" : "ERROR");

		fprintf(fp, "\t\t%s,\n",
			skill_table[sn].minimum_position == POS_DEAD ? "POS_DEAD" :
			skill_table[sn].minimum_position == POS_MORTAL ? "POS_MORTAL" :
			skill_table[sn].minimum_position == POS_INCAP ? "POS_INCAP" :
			skill_table[sn].minimum_position == POS_STUNNED ? "POS_STUNNED" :
			skill_table[sn].minimum_position == POS_SLEEPING ? "POS_SLEEPING" :
			skill_table[sn].minimum_position == POS_RESTING ? "POS_RESTING" :
			skill_table[sn].minimum_position == POS_SITTING ? "POS_SITTING" :
			skill_table[sn].minimum_position == POS_FIGHTING ? "POS_FIGHTING" :
			skill_table[sn].minimum_position == POS_STANDING ? "POS_STANDING" : "ERROR");

		fprintf(fp, "\t\t&gsn_none,\t%s%s%s%s,\t%d,\t%d,\n",
			skill_table[sn].dispel & CAN_DISPEL ? "CAN_DISPEL" : "",
			skill_table[sn].dispel & CAN_CANCEL ? "CAN_CANCEL" : "",
			skill_table[sn].dispel & CAN_CLEANSE ? "CAN_CLEANSE" : "",
			skill_table[sn].dispel & CAN_PURIFY ? "CAN_PURIFY" : "",
			skill_table[sn].min_mana,
			skill_table[sn].beats);

		fprintf(fp, "\t\t\"%s\",\t\"%s\",\t\"%s\",\t%s\n",
			skill_table[sn].noun_damage,
			skill_table[sn].msg_off,
			skill_table[sn].room_msg_off,
			skill_table[sn].ctype == CMD_SPELL ? "CMD_SPELL" :
				skill_table[sn].ctype == CMD_COMMUNE ? "CMD_COMMUNE" :
				skill_table[sn].ctype == CMD_POWER ? "CMD_POWER" :
				skill_table[sn].ctype == CMD_BOTH  ? "CMD_BOTH"  :
				skill_table[sn].ctype == CMD_RUNE  ? "CMD_RUNE"  :
				skill_table[sn].ctype == CMD_NONE ? "CMD_NONE" : "ERROR");

		fprintf(fp, "\t},\n\n");

		if (skill_table[sn].target == TAR_END)
			break;
	}

	fclose(fp);

	send_to_char("Const.c dump completed and successful.\n\r", ch);
}